

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int isEndChunkEmpty(EndNoise *en,SurfaceNoise *sn,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int z;
  uint uVar6;
  int iVar7;
  uint z_00;
  long lVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int x;
  bool bVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  long local_4e0;
  double depth [3] [3];
  int local_43c;
  float y [256];
  
  uVar4 = chunkX * 2;
  uVar5 = chunkZ * 2;
  x = chunkX * 0x10;
  z = chunkZ * 0x10;
  iVar7 = -1;
  do {
    iVar12 = -1;
    do {
      uVar6 = getEndIslands((EndIsland *)y,en->mc,seed,iVar12 + chunkX,iVar7 + chunkZ);
      if (uVar6 != 0) {
        lVar8 = (ulong)uVar6 + 1;
        piVar9 = &local_43c + (ulong)uVar6 * 4;
        do {
          iVar1 = piVar9[-3];
          iVar2 = *piVar9;
          if ((((x < iVar2 + iVar1) && (iVar3 = piVar9[-1], z < iVar3 + iVar2)) &&
              (iVar1 - iVar2 <= x + 0xf)) &&
             ((iVar3 - iVar2 <= z + 0xf &&
              (mapEndBiome(en,(int *)depth,iVar1 >> 4,iVar3 >> 4,1,1), depth[0][0]._0_4_ == 0x28))))
          {
            return 0;
          }
          lVar8 = lVar8 + -1;
          piVar9 = piVar9 + -4;
        } while (1 < lVar8);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != 2);
    iVar7 = iVar7 + 1;
    if (iVar7 == 2) {
      lVar8 = 0;
      do {
        uVar6 = (uint)lVar8 | uVar4;
        lVar11 = 0;
        do {
          z_00 = (uint)lVar11 | uVar5;
          fVar14 = getEndHeightNoise(en,uVar6,z_00,0);
          dVar15 = (double)(fVar14 + -8.0);
          depth[lVar8][lVar11] = dVar15;
          lVar10 = 8;
          do {
            dVar16 = sampleSurfaceNoiseBetween
                               (sn,uVar6,(int)lVar10,z_00,
                                (isEndChunkEmpty::inverse_drop[lVar10] - dVar15) + -0.001,
                                (isEndChunkEmpty::inverse_drop[lVar10] - dVar15) + 0.001);
            if (0.0 < ((dVar16 + dVar15 + 3000.0) * isEndChunkEmpty::upper_drop[lVar10] + -3000.0 +
                      30.0) * isEndChunkEmpty::lower_drop[lVar10] + -30.0) {
              return 0;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0xf);
          bVar13 = lVar11 == 0;
          lVar11 = lVar11 + 1;
        } while (bVar13);
        bVar13 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar13);
      lVar8 = 0x10;
      uVar6 = uVar4;
      do {
        fVar14 = getEndHeightNoise(en,uVar6,uVar5 + 2,0);
        *(double *)((long)depth[0] + lVar8) = (double)(fVar14 + -8.0);
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x58);
      lVar8 = 0;
      do {
        fVar14 = getEndHeightNoise(en,uVar4 + 2,uVar5 | (uint)lVar8,0);
        depth[2][lVar8] = (double)(fVar14 + -8.0);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_4e0 = 0;
      do {
        lVar8 = 0;
        do {
          dVar15 = depth[local_4e0][lVar8];
          lVar11 = 2;
          do {
            dVar16 = isEndChunkEmpty::inverse_drop[lVar11] - dVar15;
            dVar16 = sampleSurfaceNoiseBetween
                               (sn,uVar4 + (int)local_4e0,(int)lVar11,uVar5 + (int)lVar8,
                                dVar16 + -0.001,dVar16 + 0.001);
            if (0.0 < ((dVar16 + dVar15 + 3000.0) * isEndChunkEmpty::upper_drop[lVar11] + -3000.0 +
                      30.0) * isEndChunkEmpty::lower_drop[lVar11] + -30.0) {
              mapEndSurfaceHeight(y,en,sn,x,z,0x10,0x10,1,0);
              lVar8 = 0;
              while ((y[lVar8] == 0.0 && (!NAN(y[lVar8])))) {
                lVar8 = lVar8 + 1;
                if (lVar8 == 0x100) {
                  return 1;
                }
              }
              return 0;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x12);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_4e0 = local_4e0 + 1;
      } while (local_4e0 != 3);
      return 1;
    }
  } while( true );
}

Assistant:

int isEndChunkEmpty(const EndNoise *en, const SurfaceNoise *sn, uint64_t seed,
    int chunkX, int chunkZ)
{
    int i, j, k;
    int x = chunkX * 2;
    int z = chunkZ * 2;
    double depth[3][3];
    float y[256];

    // check if small end islands intersect this chunk
    for (j = -1; j <= +1; j++)
    {
        for (i = -1; i <= +1; i++)
        {
            EndIsland is[2];
            int n = getEndIslands(is, en->mc, seed, chunkX+i, chunkZ+j);
            while (n --> 0)
            {
                if (is[n].x + is[n].r <= chunkX*16) continue;
                if (is[n].z + is[n].r <= chunkZ*16) continue;
                if (is[n].x - is[n].r > chunkX*16 + 15) continue;
                if (is[n].z - is[n].r > chunkZ*16 + 15) continue;
                int id;
                mapEndBiome(en, &id, is[n].x >> 4, is[n].z >> 4, 1, 1);
                if (id == small_end_islands)
                    return 0;
            }
        }
    }

    // clamped (32 + 46 - y) / 64.0
    static const double upper_drop[] = {
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, // 0-7
           1.0,    1.0,    1.0,    1.0,    1.0,    1.0,    1.0, 63./64, // 8-15
        62./64, 61./64, 60./64, 59./64, 58./64, 57./64, 56./64, 55./64, // 16-23
        54./64, 53./64, 52./64, 51./64, 50./64, 49./64, 48./64, 47./64, // 24-31
        46./64 // 32
    };
    // clamped (y - 1) / 7.0
    static const double lower_drop[] = {
          0.0,  0.0, 1./7, 2./7, 3./7, 4./7, 5./7, 6./7, // 0-7
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 8-15
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 16-23
          1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0,  1.0, // 24-31
          1.0, // 32
    };
    // inverse of clamping func: ( 30 * (1-l) / l + 3000 * (1-u) ) / u
    static const double inverse_drop[] = {
        1e9, 1e9, 180.0, 75.0, 40.0, 22.5, 12.0, 5.0, // 0-7
        0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, // 8-14
        1000./21, 3000./31, 9000./61, 200.0, // 15-18
    };
    const double eps = 0.001;

    // get the inner depth values and see if they imply blocks in the chunk
    for (i = 0; i < 2; i++)
    {
        for (j = 0; j < 2; j++)
        {
            depth[i][j] = getEndHeightNoise(en, x+i, z+j, 0) - 8.0f;
            for (k = 8; k <= 14; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    return 0;
            }
        }
    }

    // fill in the depth values at the boundaries to neighbouring chunks
    for (i = 0; i < 3; i++)
        depth[i][2] = getEndHeightNoise(en, x+i, z+2, 0) - 8.0f;
    for (j = 0; j < 2; j++)
        depth[2][j] = getEndHeightNoise(en, x+2, z+j, 0) - 8.0f;

    // see if none of the noise values can generate blocks
    for (i = 0; i < 3; i++)
    {
        for (j = 0; j < 3; j++)
        {
            for (k = 2; k < 18; k++)
            {
                double u = upper_drop[k];
                double l = lower_drop[k];
                double noise = depth[i][j];
                double pivot = inverse_drop[k] - noise;
                noise += sampleSurfaceNoiseBetween(sn, x+i, k, z+j, pivot-eps, pivot+eps);
                noise = lerp(u, -3000, noise);
                noise = lerp(l, -30, noise);
                if (noise > 0)
                    goto L_check_full;
            }
        }
    }
    return 1;

L_check_full:
    mapEndSurfaceHeight(y, en, sn, chunkX*16, chunkZ*16, 16, 16, 1, 0);
    for (k = 0; k < 256; k++)
        if (y[k] != 0) return 0;
    return 1;
}